

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockSupport.cpp
# Opt level: O1

bool __thiscall MockSupport::wasLastActualCallFulfilled(MockSupport *this)

{
  bool bVar1;
  int iVar2;
  MockSupport *pMVar3;
  MockSupport *pMVar4;
  bool bVar5;
  MockSupport *node;
  
  if ((this->lastActualFunctionCall_ == (MockCheckedActualCall *)0x0) ||
     (iVar2 = (*(this->lastActualFunctionCall_->super_MockActualCall)._vptr_MockActualCall[0x2f])(),
     (char)iVar2 != '\0')) {
    pMVar4 = (MockSupport *)&this->data_;
    pMVar3 = (MockSupport *)MockNamedValueList::begin((MockNamedValueList *)pMVar4);
    while (node = pMVar3, bVar5 = node == (MockSupport *)0x0, !bVar5) {
      pMVar3 = getMockSupport(pMVar4,(MockNamedValueListNode *)node);
      if (pMVar3 != (MockSupport *)0x0) {
        pMVar4 = getMockSupport(pMVar4,(MockNamedValueListNode *)node);
        bVar1 = wasLastActualCallFulfilled(pMVar4);
        if (!bVar1) {
          return bVar5;
        }
      }
      pMVar3 = (MockSupport *)MockNamedValueListNode::next((MockNamedValueListNode *)node);
      pMVar4 = node;
    }
  }
  else {
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

bool MockSupport::wasLastActualCallFulfilled()
{
    if (lastActualFunctionCall_ && !lastActualFunctionCall_->isFulfilled())
        return false;

    for (MockNamedValueListNode* p = data_.begin(); p; p = p->next())
        if (getMockSupport(p) && !getMockSupport(p)->wasLastActualCallFulfilled())
                return false;

    return true;
}